

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

void __thiscall ConvexDecomposition::cbtHullTriangle::~cbtHullTriangle(cbtHullTriangle *this)

{
  cbtHullTriangle **ppcVar1;
  
  ppcVar1 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                      ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,this->id);
  if (*ppcVar1 == this) {
    ppcVar1 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                        ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,this->id);
    *ppcVar1 = (cbtHullTriangle *)0x0;
    return;
  }
  __assert_fail("tris[id]==this",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x931,"ConvexDecomposition::cbtHullTriangle::~cbtHullTriangle()");
}

Assistant:

~cbtHullTriangle()
	{
		assert(tris[id]==this);
		tris[id]=NULL;
	}